

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O2

void __thiscall
kj::UnixEventPort::updateNextTimerEvent
          (UnixEventPort *this,
          Maybe<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>_> *time)

{
  byte bVar1;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>_>_2
  aVar2;
  int iVar3;
  OwnFd *pOVar4;
  anon_union_4_1_a8c68091_for_NullableValue<kj::OwnFd>_2 __fd;
  bool bVar5;
  Fault f_1;
  itimerspec ts;
  
  bVar1 = (time->ptr).isSet;
  if (((bool)bVar1 != false) || (this->timerfdIsArmed == true)) {
    if ((this->timerFd).ptr.isSet == true) {
      __fd = (this->timerFd).ptr.field_1;
    }
    else {
      do {
        f_1.exception._0_4_ = timerfd_create(1,0x80800);
        if (-1 < (int)f_1.exception) goto LAB_003eff1c;
        iVar3 = kj::_::Debug::getOsErrorNumber(false);
      } while (iVar3 == -1);
      if (iVar3 != 0) {
        kj::_::Debug::Fault::Fault
                  ((Fault *)&ts,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                   ,0x30d,iVar3,"_kj_fd = timerfd_create(1, TFD_CLOEXEC | TFD_NONBLOCK)","");
        kj::_::Debug::Fault::fatal((Fault *)&ts);
      }
LAB_003eff1c:
      pOVar4 = kj::_::NullableValue<kj::OwnFd>::emplace<kj::OwnFd>
                         (&(this->timerFd).ptr,(OwnFd *)&f_1);
      __fd.value.fd = (OwnFd)pOVar4->fd;
      OwnFd::~OwnFd((OwnFd *)&f_1);
      ts.it_interval.tv_sec._0_4_ = 1;
      ts.it_interval.tv_sec._4_4_ = 1;
      ts.it_interval.tv_nsec._0_4_ = 0;
      do {
        iVar3 = epoll_ctl((this->epollFd).fd,1,(int)__fd,(epoll_event *)&ts);
        if (-1 < iVar3) goto LAB_003eff7b;
        iVar3 = kj::_::Debug::getOsErrorNumber(false);
      } while (iVar3 == -1);
      if (iVar3 != 0) {
        kj::_::Debug::Fault::Fault
                  (&f_1,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                   ,0x313,iVar3,"epoll_ctl(epollFd, EPOLL_CTL_ADD, tfd, &event)","");
        kj::_::Debug::Fault::fatal(&f_1);
      }
LAB_003eff7b:
      bVar1 = (time->ptr).isSet;
    }
    ts.it_value.tv_sec = 0;
    ts.it_value.tv_nsec = 0;
    ts.it_interval.tv_sec._0_4_ = 0;
    ts.it_interval.tv_sec._4_4_ = 0;
    ts.it_interval.tv_nsec._0_4_ = 0;
    ts.it_interval.tv_nsec._4_4_ = 0;
    bVar5 = (bVar1 & 1) != 0;
    if (bVar5) {
      aVar2 = (time->ptr).field_1;
      ts.it_value.tv_sec = (long)aVar2 / 1000000000;
      ts.it_value.tv_nsec = (long)aVar2 % 1000000000;
    }
    this->timerfdIsArmed = bVar5;
    do {
      iVar3 = timerfd_settime((int)__fd,1,(itimerspec *)&ts,(itimerspec *)0x0);
      if (-1 < iVar3) {
        return;
      }
      iVar3 = kj::_::Debug::getOsErrorNumber(false);
    } while (iVar3 == -1);
    if (iVar3 != 0) {
      kj::_::Debug::Fault::Fault
                (&f_1,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                 ,0x323,iVar3,"timerfd_settime(tfd, TFD_TIMER_ABSTIME, &ts, nullptr)","");
      kj::_::Debug::Fault::fatal(&f_1);
    }
  }
  return;
}

Assistant:

void UnixEventPort::updateNextTimerEvent(kj::Maybe<TimePoint> time) {
  if (time == kj::none && !timerfdIsArmed) {
    // No change needed.
    return;
  }

  // Create the timerfd if needed.
  int tfd;
  KJ_IF_SOME(f, timerFd) {
    tfd = f;
  } else {
    tfd = timerFd.emplace(
        KJ_SYSCALL_FD(timerfd_create(CLOCK_MONOTONIC, TFD_CLOEXEC | TFD_NONBLOCK)));

    struct epoll_event event;
    memset(&event, 0, sizeof(event));
    event.events = EPOLLIN;
    event.data.u64 = 1;
    KJ_SYSCALL(epoll_ctl(epollFd, EPOLL_CTL_ADD, tfd, &event));
  }